

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O0

void oah_print(ion_hashmap_t *hash_map,int size,ion_record_info_t *record)

{
  int local_28;
  uint local_24;
  int j;
  int i;
  ion_record_info_t *record_local;
  int size_local;
  ion_hashmap_t *hash_map_local;
  
  printf("Printing map\n");
  for (local_24 = 0; (int)local_24 < size; local_24 = local_24 + 1) {
    printf("%d -- %i ",(ulong)local_24,
           (ulong)(uint)(int)hash_map->entry
                             [(int)((record->key_size + record->value_size + 1) * local_24)]);
    if (hash_map->entry[(int)((record->key_size + record->value_size + 1) * local_24)] == -1) {
      printf("(null)");
    }
    else {
      for (local_28 = 0; local_28 < record->key_size + record->value_size; local_28 = local_28 + 1)
      {
        printf("%X ",(ulong)(byte)hash_map->entry
                                  [(long)local_28 +
                                   (long)(int)((record->key_size + record->value_size + 1) *
                                              local_24) + 1]);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void
oah_print(
	ion_hashmap_t		*hash_map,
	int					size,
	ion_record_info_t	*record
) {
	int i;

	printf("Printing map\n");

	for (i = 0; i < size; i++) {
		printf("%d -- %i ", i, ((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status);
		{
			if (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status == (ION_EMPTY | ION_DELETED)) {
				printf("(null)");
			}
			else {
				int j;

				for (j = 0; j < (record->key_size + record->value_size); j++) {
					printf("%X ", *(ion_byte_t *) (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->data + j));
				}
			}

			printf("\n");
		}
	}
}